

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
::~btree(btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *this)

{
  node_type *node;
  
  node = (this->root_).
         super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
         .
         super_Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>,_2UL,_false>
         .value;
  if (node != (node_type *)0x0) {
    internal_clear(this,node);
  }
  (this->root_).
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
  .
  super_Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>,_2UL,_false>
  .value = (T)0x0;
  this->rightmost_ = (node_type *)0x0;
  this->size_ = 0;
  return;
}

Assistant:

~btree() {
    static_assert(std::is_nothrow_copy_constructible<key_compare>::value,
                  "Key comparison must be nothrow copy constructible");
    static_assert(std::is_nothrow_copy_constructible<allocator_type>::value,
                  "Allocator must be nothrow copy constructible");
    static_assert(is_trivially_copyable<iterator>::value,
                  "iterator not trivially copyable.");
    clear();
  }